

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePickerPrivate::DateTimePickerPrivate
          (DateTimePickerPrivate *this,DateTimePicker *parent,Type parserType)

{
  Scroller *this_00;
  QTime local_54;
  QTime local_50;
  QTime local_4c;
  QDate local_48;
  QDate local_40;
  QDate local_38;
  
  DateTimeParser::DateTimeParser(&this->super_DateTimeParser,parserType);
  (this->super_DateTimeParser)._vptr_DateTimeParser =
       (_func_int **)&PTR__DateTimePickerPrivate_0019c080;
  this->q = parent;
  QDate::QDate(&local_38,0x6d8,9,0xe);
  QTime::QTime(&local_4c,0,0,0,0);
  QDateTime::QDateTime(&this->minimum,local_38,local_4c,LocalTime,0);
  QDate::QDate(&local_40,7999,0xc,0x1f);
  QTime::QTime(&local_50,0x17,0x3b,0x3b,999);
  QDateTime::QDateTime(&this->maximum,local_40,local_50,LocalTime,0);
  QDate::QDate(&local_48,2000,1,1);
  QTime::QTime(&local_54,0,0,0,0);
  QDateTime::QDateTime(&this->value,local_48,local_54,LocalTime,0);
  this->spec = LocalTime;
  this->itemHeight = 0;
  this->itemTopMargin = 0;
  this->itemsMaxCount = 5;
  this->itemSideMargin = 5;
  this->widgetHeight = 0;
  this->currentItemY = 0;
  (this->mousePos).xp = 0;
  (this->mousePos).yp = 0;
  this->leftMouseButtonPressed = false;
  this->movableSection = -1;
  this->daysSection = -1;
  this->monthSection = -1;
  this->yearSection = -1;
  this_00 = (Scroller *)operator_new(0x18);
  Scroller::Scroller(this_00,(QObject *)this->q,(QObject *)this->q);
  this->scroller = this_00;
  this->scrolling = false;
  initDaysMonthYearSectionIndex(this);
  fillValues(this,true);
  return;
}

Assistant:

DateTimePickerPrivate( DateTimePicker * parent,
		QMetaType::Type parserType )
		:	DateTimeParser( parserType )
		,	q( parent )
		,	minimum( QDateTime( DATETIMEPICKER_COMPAT_DATE_MIN,
				DATETIMEPICKER_TIME_MIN ) )
		,	maximum( DATETIMEPICKER_DATETIME_MAX )
		,	value( QDateTime( DATETIMEPICKER_DATE_INITIAL,
				DATETIMEPICKER_TIME_MIN ) )
		,	spec( Qt::LocalTime )
		,	itemHeight( 0 )
		,	itemTopMargin( 0 )
		,	itemsMaxCount( 5 )
		,	itemSideMargin( 5 )
		,	widgetHeight( 0 )
		,	currentItemY( 0 )
		,	leftMouseButtonPressed( false )
		,	movableSection( -1 )
		,	daysSection( -1 )
		,	monthSection( -1 )
		,	yearSection( -1 )
		,	scroller( new Scroller( q, q ) )
		,	scrolling( false )
	{
		initDaysMonthYearSectionIndex();
		fillValues();
	}